

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O1

int insertNewKeyValue(MAP_HANDLE_DATA *handleData,char *key,char *value)

{
  size_t sVar1;
  int iVar2;
  ulong uVar3;
  char **ppcVar4;
  LOGGER_LOG p_Var5;
  int iVar6;
  ulong uVar7;
  char *pcVar8;
  char *pcVar9;
  size_t __size;
  
  uVar3 = handleData->count + 1;
  uVar7 = 0xffffffffffffffff;
  if (uVar3 != 0) {
    uVar7 = uVar3;
  }
  if ((uVar7 >> 0x3d == 0) &&
     (ppcVar4 = (char **)realloc(handleData->keys,-(ulong)(uVar7 >> 0x3d != 0) | uVar7 << 3),
     ppcVar4 != (char **)0x0)) {
    handleData->keys = ppcVar4;
    sVar1 = handleData->count;
    ppcVar4[sVar1] = (char *)0x0;
    uVar7 = sVar1 + 1;
    if (uVar7 == 0) {
      uVar7 = 0xffffffffffffffff;
    }
    __size = uVar7 * 8;
    if (uVar7 < 0x2000000000000000) {
      ppcVar4 = (char **)realloc(handleData->values,__size);
      if (ppcVar4 != (char **)0x0) {
        handleData->values = ppcVar4;
        sVar1 = handleData->count;
        ppcVar4[sVar1] = (char *)0x0;
        handleData->count = sVar1 + 1;
        iVar2 = mallocAndStrcpy_s(handleData->keys + sVar1,key);
        if (iVar2 == 0) {
          iVar2 = mallocAndStrcpy_s(handleData->values + (handleData->count - 1),value);
          if (iVar2 == 0) {
            return 0;
          }
          free(handleData->keys[handleData->count - 1]);
          Map_DecreaseStorageKeysValues(handleData);
          p_Var5 = xlogging_get_log_function();
          iVar2 = 0x149;
          if (p_Var5 == (LOGGER_LOG)0x0) {
            return 0x149;
          }
          pcVar8 = "insertNewKeyValue";
          pcVar9 = "unable to mallocAndStrcpy_s";
          iVar6 = 0x148;
        }
        else {
          Map_DecreaseStorageKeysValues(handleData);
          p_Var5 = xlogging_get_log_function();
          iVar2 = 0x140;
          if (p_Var5 == (LOGGER_LOG)0x0) {
            return 0x140;
          }
          pcVar8 = "insertNewKeyValue";
          pcVar9 = "unable to mallocAndStrcpy_s";
          iVar6 = 0x13f;
        }
        goto LAB_00169975;
      }
    }
    else {
      __size = 0xffffffffffffffff;
    }
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 != (LOGGER_LOG)0x0) {
      (*p_Var5)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/map.c"
                ,"Map_IncreaseStorageKeysValues",0xb9,1,"realloc error, size:%zu",__size);
    }
    uVar7 = handleData->count;
    if (uVar7 == 0) {
      free(handleData->keys);
      handleData->keys = (char **)0x0;
    }
    else {
      if ((0x1fffffffffffffff < uVar7) ||
         (ppcVar4 = (char **)realloc(handleData->keys,uVar7 * 8), ppcVar4 == (char **)0x0)) {
        p_Var5 = xlogging_get_log_function();
        iVar2 = 0x138;
        if (p_Var5 == (LOGGER_LOG)0x0) {
          return 0x138;
        }
        pcVar8 = "Map_IncreaseStorageKeysValues";
        pcVar9 = "CATASTROPHIC error, unable to undo through realloc to a smaller size, size:%zu";
        iVar6 = 0xc6;
        goto LAB_00169975;
      }
      handleData->keys = ppcVar4;
    }
    iVar2 = 0x138;
  }
  else {
    p_Var5 = xlogging_get_log_function();
    iVar2 = 0x138;
    if (p_Var5 == (LOGGER_LOG)0x0) {
      return 0x138;
    }
    pcVar8 = "Map_IncreaseStorageKeysValues";
    pcVar9 = "realloc error, size:%zu";
    iVar6 = 0xac;
LAB_00169975:
    (*p_Var5)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/map.c"
              ,pcVar8,iVar6,1,pcVar9);
  }
  return iVar2;
}

Assistant:

static int insertNewKeyValue(MAP_HANDLE_DATA* handleData, const char* key, const char* value)
{
    int result;
    if (Map_IncreaseStorageKeysValues(handleData) != 0) /*this increases handleData->count*/
    {
        result = MU_FAILURE;
    }
    else
    {
        if (mallocAndStrcpy_s(&(handleData->keys[handleData->count - 1]), key) != 0)
        {
            Map_DecreaseStorageKeysValues(handleData);
            LogError("unable to mallocAndStrcpy_s");
            result = MU_FAILURE;
        }
        else
        {
            if (mallocAndStrcpy_s(&(handleData->values[handleData->count - 1]), value) != 0)
            {
                free(handleData->keys[handleData->count - 1]);
                Map_DecreaseStorageKeysValues(handleData);
                LogError("unable to mallocAndStrcpy_s");
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }
        }
    }
    return result;
}